

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right.cpp
# Opt level: O0

ScalarFunction * duckdb::LeftGraphemeFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  allocator_type *in_stack_fffffffffffffea8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffeb0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  LogicalType *local_e8;
  LogicalType local_c8 [24];
  undefined1 local_b0 [32];
  LogicalType local_90 [40];
  LogicalType *local_68;
  LogicalType local_60 [24];
  LogicalType local_48 [24];
  LogicalType *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_68 = local_60;
  duckdb::LogicalType::LogicalType(local_68,VARCHAR);
  local_68 = local_48;
  duckdb::LogicalType::LogicalType(local_68,BIGINT);
  local_30 = local_60;
  local_28 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe96ef8);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffec0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffeb8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffec4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffeb0,iVar1,in_stack_fffffffffffffea8);
  duckdb::LogicalType::LogicalType(local_90,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  duckdb::LogicalType::LogicalType(local_c8,INVALID);
  duckdb::ScalarFunction::ScalarFunction(in_RDI,local_20,local_90,local_b0,0,0,0,0,local_c8,0,0,0);
  duckdb::LogicalType::~LogicalType(local_c8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe96fd2);
  duckdb::LogicalType::~LogicalType(local_90);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe96fec);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe96ff9);
  local_e8 = (LogicalType *)&local_30;
  do {
    local_e8 = local_e8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_e8);
  } while (local_e8 != local_60);
  return in_RDI;
}

Assistant:

ScalarFunction LeftGraphemeFun::GetFunction() {
	return ScalarFunction({LogicalType::VARCHAR, LogicalType::BIGINT}, LogicalType::VARCHAR,
	                      LeftFunction<LeftRightGrapheme>);
}